

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O1

void __thiscall
TPZCheckMesh::BuildDependList(TPZCheckMesh *this,int connect,TPZStack<int,_10> *dependlist)

{
  TPZConnect *pTVar1;
  TPZDepend *pTVar2;
  ulong nelem;
  uint uVar3;
  
  uVar3 = (uint)(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  if (0 < (int)uVar3) {
    nelem = 0;
    do {
      pTVar1 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
      if (pTVar1->fDependList != (TPZDepend *)0x0) {
        pTVar2 = TPZConnect::TPZDepend::HasDepend(pTVar1->fDependList,(long)connect);
        if (pTVar2 != (TPZDepend *)0x0) {
          TPZStack<int,_10>::Push(dependlist,(int)nelem);
        }
      }
      nelem = nelem + 1;
    } while ((uVar3 & 0x7fffffff) != nelem);
  }
  return;
}

Assistant:

void TPZCheckMesh::BuildDependList(int connect, TPZStack<int> &dependlist) {
	int nconnects = fMesh->ConnectVec().NElements();
	int ic;
	for(ic=0; ic<nconnects; ic++) {
		TPZConnect::TPZDepend *dep = fMesh->ConnectVec()[ic].FirstDepend();
		if(dep && dep->HasDepend(connect)) {
			dependlist.Push(ic);
			continue;
		}
	}
}